

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

int getNum(char *str,uint32_t *val,int8_t *opt)

{
  int iVar1;
  undefined1 *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  intmax_t v;
  int n;
  int f;
  long local_30;
  int local_28;
  int local_24;
  undefined1 *local_20;
  undefined4 *local_18;
  undefined8 local_10;
  int local_4;
  
  *in_RDX = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24 = __isoc99_sscanf(in_RDI," %ji %n",&local_30,&local_28);
  if (local_24 == 1) {
    *local_18 = (int)local_30;
    *local_20 = 1;
    local_4 = local_28;
  }
  else {
    local_24 = __isoc99_sscanf(local_10," v%ji %n",&local_30,&local_28);
    if (local_24 == 1) {
      *local_18 = (int)local_30;
      if (local_30 < 0x96) {
        *local_20 = 2;
      }
      else {
        *local_20 = 0xfe;
      }
      local_4 = local_28;
    }
    else {
      iVar1 = __isoc99_sscanf(local_10," p%ji %n",&local_30,&local_28);
      if (iVar1 == 1) {
        *local_18 = (int)local_30;
        if (local_30 < 10) {
          *local_20 = 3;
        }
        else {
          *local_20 = 0xfd;
        }
        local_4 = local_28;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int getNum(char *str, uint32_t *val, int8_t *opt)
{
   int f, n;
   intmax_t v;

   *opt = 0;

   f = sscanf(str, " %ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      *opt = CMD_NUMERIC;
      return n;
   }

   f = sscanf(str, " v%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_VARS) *opt = CMD_VAR;
      else *opt = -CMD_VAR;
      return n;
   }

   f = sscanf(str, " p%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_PARAMS) *opt = CMD_PAR;
      else *opt = -CMD_PAR;
      return n;
   }

   return 0;
}